

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O1

int ssl_parse_certificate_request(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_ciphersuite_t *pmVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  mbedtls_ssl_key_cert *pmVar5;
  long lVar6;
  mbedtls_pk_context *pmVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  
  pmVar1 = ssl->transform_negotiate->ciphersuite_info;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0x945,"=> parse certificate request");
  if (pmVar1->key_exchange - MBEDTLS_KEY_EXCHANGE_PSK < 4) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x94c,"<= skip parse certificate request");
    ssl->state = ssl->state + 1;
    return 0;
  }
  if (ssl->record_read == 0) {
    iVar3 = mbedtls_ssl_read_record(ssl);
    if (iVar3 != 0) {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x955,"mbedtls_ssl_read_record",iVar3);
      return iVar3;
    }
    if (ssl->in_msgtype != 0x16) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x95b,"bad certificate request message");
      return -0x7700;
    }
    ssl->record_read = 1;
  }
  ssl->client_auth = 0;
  ssl->state = ssl->state + 1;
  if (*ssl->in_msg == '\r') {
    ssl->client_auth = 1;
  }
  pcVar8 = "a";
  if (ssl->client_auth == 0) {
    pcVar8 = "no";
  }
  iVar3 = 0;
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0x969,"got %s certificate request",pcVar8);
  if (ssl->client_auth == 0) {
LAB_001656be:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x9c5,"<= parse certificate request");
  }
  else {
    ssl->record_read = 0;
    puVar2 = ssl->in_msg;
    uVar9 = (ulong)((ssl->conf->field_0x164 & 2) >> 1);
    uVar10 = (ulong)puVar2[uVar9 * 8 + 4];
    if (ssl->in_hslen < uVar10 + uVar9 * 8 + 6) {
      iVar3 = 0x984;
    }
    else {
      if (uVar10 != 0) {
        lVar6 = uVar9 * 8 + 5;
        uVar9 = 0;
        iVar11 = 1;
        do {
          if (puVar2[uVar9 + lVar6] == '\x01') {
            if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
               (pmVar5 = ssl->handshake->key_cert, pmVar5 == (mbedtls_ssl_key_cert *)0x0)) {
              pmVar5 = ssl->conf->key_cert;
            }
            if (pmVar5 == (mbedtls_ssl_key_cert *)0x0) {
              pmVar7 = (mbedtls_pk_context *)0x0;
            }
            else {
              pmVar7 = pmVar5->key;
            }
            iVar4 = mbedtls_pk_can_do(pmVar7,MBEDTLS_PK_RSA);
            if (iVar4 == 0) goto LAB_0016556b;
LAB_00165604:
            ssl->handshake->cert_type = iVar11;
            break;
          }
LAB_0016556b:
          if (puVar2[uVar9 + lVar6] == '@') {
            if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
               (pmVar5 = ssl->handshake->key_cert, pmVar5 == (mbedtls_ssl_key_cert *)0x0)) {
              pmVar5 = ssl->conf->key_cert;
            }
            if (pmVar5 == (mbedtls_ssl_key_cert *)0x0) {
              pmVar7 = (mbedtls_pk_context *)0x0;
            }
            else {
              pmVar7 = pmVar5->key;
            }
            iVar4 = mbedtls_pk_can_do(pmVar7,MBEDTLS_PK_ECDSA);
            if (iVar4 != 0) {
              iVar11 = 0x40;
              goto LAB_00165604;
            }
          }
          uVar9 = uVar9 + 1;
        } while (uVar10 != uVar9);
      }
      if (ssl->minor_ver == 3) {
        uVar9 = (ulong)((ssl->conf->field_0x164 & 2) >> 1);
        uVar10 = uVar10 + (ushort)(*(ushort *)(puVar2 + uVar10 + uVar9 * 8 + 5) << 8 |
                                  *(ushort *)(puVar2 + uVar10 + uVar9 * 8 + 5) >> 8);
        lVar6 = 2;
        if (ssl->in_hslen < uVar10 + uVar9 * 8 + 6) {
          iVar3 = 0x9b2;
          goto LAB_001656fd;
        }
      }
      else {
        lVar6 = 0;
      }
      uVar9 = (ulong)((ssl->conf->field_0x164 & 2) >> 1);
      if (ssl->in_hslen ==
          uVar10 + lVar6 + uVar9 * 8 +
          (ulong)(ushort)(*(ushort *)(puVar2 + uVar10 + lVar6 + uVar9 * 8 + 5) << 8 |
                         *(ushort *)(puVar2 + uVar10 + lVar6 + uVar9 * 8 + 5) >> 8) + 7)
      goto LAB_001656be;
      iVar3 = 0x9c0;
    }
LAB_001656fd:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,iVar3,"bad certificate request message");
    iVar3 = -0x7a80;
  }
  return iVar3;
}

Assistant:

static int ssl_parse_certificate_request( mbedtls_ssl_context *ssl )
{
    int ret;
    unsigned char *buf, *p;
    size_t n = 0, m = 0;
    size_t cert_type_len = 0, dn_len = 0;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse certificate request" ) );

    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse certificate request" ) );
        ssl->state++;
        return( 0 );
    }

    if( ssl->record_read == 0 )
    {
        if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
            return( ret );
        }

        if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate request message" ) );
            return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
        }

        ssl->record_read = 1;
    }

    ssl->client_auth = 0;
    ssl->state++;

    if( ssl->in_msg[0] == MBEDTLS_SSL_HS_CERTIFICATE_REQUEST )
        ssl->client_auth++;

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "got %s certificate request",
                        ssl->client_auth ? "a" : "no" ) );

    if( ssl->client_auth == 0 )
        goto exit;

    ssl->record_read = 0;

    // TODO: handshake_failure alert for an anonymous server to request
    // client authentication

    /*
     *  struct {
     *      ClientCertificateType certificate_types<1..2^8-1>;
     *      SignatureAndHashAlgorithm
     *        supported_signature_algorithms<2^16-1>; -- TLS 1.2 only
     *      DistinguishedName certificate_authorities<0..2^16-1>;
     *  } CertificateRequest;
     */
    buf = ssl->in_msg;

    // Retrieve cert types
    //
    cert_type_len = buf[mbedtls_ssl_hs_hdr_len( ssl )];
    n = cert_type_len;

    if( ssl->in_hslen < mbedtls_ssl_hs_hdr_len( ssl ) + 2 + n )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate request message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_REQUEST );
    }

    p = buf + mbedtls_ssl_hs_hdr_len( ssl ) + 1;
    while( cert_type_len > 0 )
    {
#if defined(MBEDTLS_RSA_C)
        if( *p == MBEDTLS_SSL_CERT_TYPE_RSA_SIGN &&
            mbedtls_pk_can_do( mbedtls_ssl_own_key( ssl ), MBEDTLS_PK_RSA ) )
        {
            ssl->handshake->cert_type = MBEDTLS_SSL_CERT_TYPE_RSA_SIGN;
            break;
        }
        else
#endif
#if defined(MBEDTLS_ECDSA_C)
        if( *p == MBEDTLS_SSL_CERT_TYPE_ECDSA_SIGN &&
            mbedtls_pk_can_do( mbedtls_ssl_own_key( ssl ), MBEDTLS_PK_ECDSA ) )
        {
            ssl->handshake->cert_type = MBEDTLS_SSL_CERT_TYPE_ECDSA_SIGN;
            break;
        }
        else
#endif
        {
            ; /* Unsupported cert type, ignore */
        }

        cert_type_len--;
        p++;
    }

#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        /* Ignored, see comments about hash in write_certificate_verify */
        // TODO: should check the signature part against our pk_key though
        size_t sig_alg_len = ( ( buf[mbedtls_ssl_hs_hdr_len( ssl ) + 1 + n] <<  8 )
                             | ( buf[mbedtls_ssl_hs_hdr_len( ssl ) + 2 + n]       ) );

        m += 2;
        n += sig_alg_len;

        if( ssl->in_hslen < mbedtls_ssl_hs_hdr_len( ssl ) + 2 + n )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate request message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_REQUEST );
        }
    }
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

    /* Ignore certificate_authorities, we only have one cert anyway */
    // TODO: should not send cert if no CA matches
    dn_len = ( ( buf[mbedtls_ssl_hs_hdr_len( ssl ) + 1 + m + n] <<  8 )
             | ( buf[mbedtls_ssl_hs_hdr_len( ssl ) + 2 + m + n]       ) );

    n += dn_len;
    if( ssl->in_hslen != mbedtls_ssl_hs_hdr_len( ssl ) + 3 + m + n )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate request message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_REQUEST );
    }

exit:
    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse certificate request" ) );

    return( 0 );
}